

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O1

void __thiscall
Catch::Capturer::captureValues<char[5],long_long>
          (Capturer *this,size_t index,char (*value) [5],longlong *values)

{
  void *pvVar1;
  longlong *plVar2;
  char *pcVar3;
  StringRef string;
  string local_48;
  
  plVar2 = values;
  pvVar1 = memchr(value,0,5);
  pcVar3 = (char *)((long)pvVar1 - (long)value);
  if (pvVar1 == (void *)0x0) {
    pcVar3 = (char *)0x5;
  }
  string.m_size = (size_type)plVar2;
  string.m_start = pcVar3;
  Detail::convertIntoString_abi_cxx11_(&local_48,(Detail *)value,string);
  captureValue(this,index,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  captureValues<long_long>(this,index + 1,values);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }